

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall
Database::addUser(Database *this,string *userName,string *alias,string *bio,string *password)

{
  sqlite3 *db;
  int iVar1;
  char *pcVar2;
  DatabaseException *this_00;
  ostream *this_01;
  string local_190 [39];
  allocator local_169;
  string local_168 [8];
  string error;
  int failure;
  string local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [8];
  string query;
  char *local_38;
  char *errorMsg;
  string *password_local;
  string *bio_local;
  string *alias_local;
  string *userName_local;
  Database *this_local;
  
  local_38 = (char *)0x0;
  errorMsg = (char *)password;
  password_local = bio;
  bio_local = alias;
  alias_local = userName;
  userName_local = (string *)this;
  std::operator+((char *)local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "insert into users (username, alias, bio, password) values (\'");
  std::operator+(local_118,(char *)local_138);
  std::operator+(local_f8,local_118);
  std::operator+(local_d8,(char *)local_f8);
  std::operator+(local_b8,local_d8);
  std::operator+(local_98,(char *)local_b8);
  std::operator+(local_78,local_98);
  std::operator+(local_58,(char *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string(local_138);
  db = this->database;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = sqlite3_exec(db,pcVar2,(sqlite3_callback)0x0,(void *)0x0,&local_38);
  pcVar2 = local_38;
  if (iVar1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,pcVar2,&local_169);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    sqlite3_free(local_38);
    this_00 = (DatabaseException *)__cxa_allocate_exception(0x28);
    std::operator+((char *)local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Error while adding user: ");
    DatabaseException::DatabaseException(this_00,local_190);
    __cxa_throw(this_00,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
  }
  this_01 = std::operator<<((ostream *)&std::cout,"User added successfully");
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void Database::addUser(std::string userName, std::string alias, std::string bio, std::string password)
{
	char* errorMsg = nullptr;
	std::string query = "insert into users (username, alias, bio, password) values ('" +
						userName + "','" + alias + "','" + bio + "','" + password + "');";

	int failure = sqlite3_exec(database, query.c_str(), nullptr, nullptr, &errorMsg);

	if(failure)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while adding user: " + error);
	}
	else
	{
		std::cout << "User added successfully" << std::endl;
	}
}